

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O3

int X509_check_issued(X509 *issuer,X509 *subject)

{
  int iVar1;
  X509_NAME *a;
  X509_NAME *b;
  int iVar2;
  
  a = X509_get_subject_name(issuer);
  b = X509_get_issuer_name(subject);
  iVar1 = X509_NAME_cmp(a,b);
  iVar2 = 0x1d;
  if (iVar1 == 0) {
    iVar1 = x509v3_cache_extensions((X509 *)issuer);
    iVar2 = 1;
    if ((iVar1 != 0) && (iVar1 = x509v3_cache_extensions((X509 *)subject), iVar1 != 0)) {
      if (((AUTHORITY_KEYID *)subject->ex_flags != (AUTHORITY_KEYID *)0x0) &&
         (iVar1 = X509_check_akid(issuer,(AUTHORITY_KEYID *)subject->ex_flags), iVar1 != 0)) {
        return iVar1;
      }
      if ((((issuer->ex_data).dummy & 2) == 0) ||
         (iVar2 = 0x20, ((issuer->ex_data).field_0xc & 4) != 0)) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

int X509_check_issued(X509 *issuer, X509 *subject) {
  if (X509_NAME_cmp(X509_get_subject_name(issuer),
                    X509_get_issuer_name(subject))) {
    return X509_V_ERR_SUBJECT_ISSUER_MISMATCH;
  }
  if (!x509v3_cache_extensions(issuer) || !x509v3_cache_extensions(subject)) {
    return X509_V_ERR_UNSPECIFIED;
  }

  if (subject->akid) {
    int ret = X509_check_akid(issuer, subject->akid);
    if (ret != X509_V_OK) {
      return ret;
    }
  }

  if (ku_reject(issuer, X509v3_KU_KEY_CERT_SIGN)) {
    return X509_V_ERR_KEYUSAGE_NO_CERTSIGN;
  }
  return X509_V_OK;
}